

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

int doh_done(Curl_easy *doh,CURLcode result)

{
  Curl_easy *data_00;
  dohdata *pdVar1;
  char *pcVar2;
  dohdata *dohp;
  Curl_easy *data;
  CURLcode result_local;
  Curl_easy *doh_local;
  
  data_00 = (doh->set).dohfor;
  pdVar1 = (data_00->req).doh;
  pdVar1->pending = pdVar1->pending - 1;
  if ((data_00 != (Curl_easy *)0x0) && ((*(ulong *)&(data_00->set).field_0x8ba >> 0x1c & 1) != 0)) {
    Curl_infof(data_00,"a DoH request is completed, %u to go",(ulong)pdVar1->pending);
  }
  if (((result != CURLE_OK) && (data_00 != (Curl_easy *)0x0)) &&
     ((*(ulong *)&(data_00->set).field_0x8ba >> 0x1c & 1) != 0)) {
    pcVar2 = curl_easy_strerror(result);
    Curl_infof(data_00,"DoH request %s",pcVar2);
  }
  if (pdVar1->pending == 0) {
    curl_slist_free_all(pdVar1->headers);
    pdVar1->headers = (curl_slist *)0x0;
    Curl_expire(data_00,0,EXPIRE_RUN_NOW);
  }
  return 0;
}

Assistant:

static int doh_done(struct Curl_easy *doh, CURLcode result)
{
  struct Curl_easy *data = doh->set.dohfor;
  struct dohdata *dohp = data->req.doh;
  /* so one of the DoH request done for the 'data' transfer is now complete! */
  dohp->pending--;
  infof(data, "a DoH request is completed, %u to go", dohp->pending);
  if(result)
    infof(data, "DoH request %s", curl_easy_strerror(result));

  if(!dohp->pending) {
    /* DoH completed */
    curl_slist_free_all(dohp->headers);
    dohp->headers = NULL;
    Curl_expire(data, 0, EXPIRE_RUN_NOW);
  }
  return 0;
}